

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

void __thiscall
cs::compiler_type::translate_into_tokens
          (compiler_type *this,deque<char,_std::allocator<char>_> *char_buff,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset encoding)

{
  preprocessor local_b0;
  
  preprocessor::preprocessor(&local_b0,&this->context,this,char_buff,tokens,encoding);
  preprocessor::~preprocessor(&local_b0);
  return;
}

Assistant:

void compiler_type::translate_into_tokens(const std::deque<char> &char_buff, std::deque<token_base *> &tokens,
	        charset encoding)
	{
		preprocessor(context, *this, char_buff, tokens, encoding);
	}